

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImageCubeBufferCase::createTexture(TexImageCubeBufferCase *this)

{
  int iVar1;
  deUint32 seed;
  int iVar2;
  deInt32 rowPitch_00;
  char *str;
  TransferFormat TVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  int local_e0;
  PixelBufferAccess local_c8;
  undefined1 local_9c [8];
  Vec4 gMax;
  Vec4 gMin;
  deUint32 buf;
  int face;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  data;
  int height;
  int rowPitch;
  int rowLength;
  int pixelSize;
  deUint32 local_2c;
  deUint32 dStack_28;
  TransferFormat fmt;
  deUint32 tex;
  Random rnd;
  TexImageCubeBufferCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)&fmt.dataType,seed);
  fmt.format = 0;
  TVar3 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  iVar2 = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeSpecCase).m_texFormat);
  if (this->m_rowLength < 1) {
    local_e0 = (this->super_TextureCubeSpecCase).m_size + this->m_skipPixels;
  }
  else {
    local_e0 = this->m_rowLength;
  }
  rowPitch_00 = deAlign32(local_e0 * iVar2,this->m_alignment);
  data.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_TextureCubeSpecCase).m_size + this->m_skipRows;
  std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
            ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             ((long)&buf + 3));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)&face,6,
           (allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
           ((long)&buf + 3));
  std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
            ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             ((long)&buf + 3));
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             &fmt.format);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             fmt.format);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (gMin.m_data[3] = 0.0; (int)gMin.m_data[3] < 6;
      gMin.m_data[3] = (float)((int)gMin.m_data[3] + 1)) {
    gMin.m_data[2] = 0.0;
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)&fmt.dataType,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_9c,(Random *)&fmt.dataType,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
    pvVar4 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&face,(long)(int)gMin.m_data[3]);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (pvVar4,(long)(rowPitch_00 *
                             data.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                            this->m_offset));
    iVar1 = (this->super_TextureCubeSpecCase).m_size;
    pvVar4 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&face,(long)(int)gMin.m_data[3]);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar4,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_c8,&(this->super_TextureCubeSpecCase).m_texFormat,iVar1,iVar1,1,rowPitch_00,0,
               pvVar5 + (long)this->m_offset +
                        (long)(this->m_skipPixels * iVar2) + (long)(this->m_skipRows * rowPitch_00))
    ;
    tcu::fillWithComponentGradients(&local_c8,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_9c);
    sglr::ContextWrapper::glGenBuffers
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
               (deUint32 *)(gMin.m_data + 2));
    sglr::ContextWrapper::glBindBuffer
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
               (deUint32)gMin.m_data[2]);
    pvVar4 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&face,(long)(int)gMin.m_data[3]);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar4);
    pvVar4 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&face,(long)(int)gMin.m_data[3]);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar4,0);
    sglr::ContextWrapper::glBufferData
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
               (long)(int)sVar6,pvVar5,0x88e4);
    sglr::ContextWrapper::glPixelStorei
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
               this->m_rowLength);
    sglr::ContextWrapper::glPixelStorei
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
               this->m_skipRows);
    sglr::ContextWrapper::glPixelStorei
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
               this->m_skipPixels);
    sglr::ContextWrapper::glPixelStorei
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
               this->m_alignment);
    iVar1 = (this->super_TextureCubeSpecCase).m_size;
    local_2c = TVar3.format;
    dStack_28 = TVar3.dataType;
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,
               *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[3] * 4),0,
               this->m_internalFormat,iVar1,iVar1,0,local_2c,dStack_28,(void *)(long)this->m_offset)
    ;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&face);
  de::Random::~Random((Random *)&fmt.dataType);
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random					rnd			(deStringHash(getName()));
		deUint32					tex			= 0;
		glu::TransferFormat			fmt			= glu::getTransferFormat(m_texFormat);
		const int					pixelSize	= m_texFormat.getPixelSize();
		const int					rowLength	= m_rowLength > 0 ? m_rowLength : m_size + m_skipPixels;
		const int					rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
		const int					height		= m_size + m_skipRows;
		vector<vector<deUint8> >	data		(DE_LENGTH_OF_ARRAY(s_cubeMapFaces));

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			deUint32 buf = 0;

			{
				const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				data[face].resize(rowPitch*height + m_offset);
				tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, rowPitch, 0, &data[face][0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), gMin, gMax);
			}

			// Create buffer and upload.
			glGenBuffers(1, &buf);
			glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
			glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data[face].size(), &data[face][0], GL_STATIC_DRAW);

			glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
			glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
			glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
			glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, fmt.format, fmt.dataType, (const void*)(deUintptr)m_offset);
		}
	}